

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setsout.c
# Opt level: O2

void set_sysout(int version,char *sysout_file_name)

{
  int __fd;
  __off_t _Var1;
  ssize_t sVar2;
  char *__s;
  IFPAGE ifpage;
  
  __s = (char *)&ifpage;
  __fd = open(sysout_file_name,2);
  if (__fd == -1) {
    sprintf((char *)&ifpage,"sysout_loader: can\'t open sysout file: %s",sysout_file_name);
    goto LAB_001012e1;
  }
  _Var1 = lseek(__fd,0x200,0);
  if (_Var1 != -1) {
    sVar2 = read(__fd,&ifpage,0xb0);
    if (sVar2 == -1) {
      __s = "sysout_loader: can\'t read IFPAGE";
      goto LAB_001012e1;
    }
    word_swap_page(&ifpage,0x2c);
    ifpage.lversion = (DLword)version;
    ifpage.minbversion = (DLword)version;
    _Var1 = lseek(__fd,0x200,0);
    if (_Var1 != -1) {
      sVar2 = write(__fd,&ifpage,0xb0);
      if (sVar2 != -1) {
        close(__fd);
        printf("%d",(ulong)ifpage.minbversion);
        return;
      }
      __s = "Can\'t write IFPAGE";
      goto LAB_001012e1;
    }
  }
  __s = "sysout_loader: can\'t seek to IFPAGE";
LAB_001012e1:
  perror(__s);
  exit(-1);
}

Assistant:

void set_sysout(int version, char *sysout_file_name) {
  int sysout;    /* SysoutFile descriptor */
  IFPAGE ifpage; /* IFPAGE */
  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDWR);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

  ifpage.lversion = version;
  ifpage.minbversion = version;

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (write(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("Can't write IFPAGE");
    exit(-1);
  }

  close(sysout);
  printf("%d", ifpage.minbversion);
}